

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void CalcResizePosSizeFromAnyCorner
               (ImGuiWindow *window,ImVec2 *corner_target,ImVec2 *corner_norm,ImVec2 *out_pos,
               ImVec2 *out_size)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar3 = (*corner_target).x;
  fVar4 = (*corner_target).y;
  fVar9 = (window->Pos).x;
  fVar5 = (window->Size).x + fVar9;
  fVar10 = (window->Pos).y;
  fVar6 = (window->Size).y + fVar10;
  fVar7 = (*corner_norm).x;
  fVar8 = (*corner_norm).y;
  fVar9 = (fVar9 - fVar3) * fVar7 + fVar3;
  fVar10 = (fVar10 - fVar4) * fVar8 + fVar4;
  IVar2.y = fVar10;
  IVar2.x = fVar9;
  fVar9 = ((fVar3 - fVar5) * fVar7 + fVar5) - fVar9;
  fVar10 = ((fVar4 - fVar6) * fVar8 + fVar6) - fVar10;
  IVar1.y = fVar10;
  IVar1.x = fVar9;
  IVar1 = CalcSizeAfterConstraint(window,IVar1);
  *out_pos = IVar2;
  if ((corner_norm->x == 0.0) && (!NAN(corner_norm->x))) {
    out_pos->x = out_pos->x - (IVar1.x - fVar9);
  }
  if ((corner_norm->y == 0.0) && (!NAN(corner_norm->y))) {
    out_pos->y = out_pos->y - (IVar1.y - fVar10);
  }
  *out_size = IVar1;
  return;
}

Assistant:

static void CalcResizePosSizeFromAnyCorner(ImGuiWindow* window, const ImVec2& corner_target, const ImVec2& corner_norm, ImVec2* out_pos, ImVec2* out_size)
{
    ImVec2 pos_min = ImLerp(corner_target, window->Pos, corner_norm);                // Expected window upper-left
    ImVec2 pos_max = ImLerp(window->Pos + window->Size, corner_target, corner_norm); // Expected window lower-right
    ImVec2 size_expected = pos_max - pos_min;
    ImVec2 size_constrained = CalcSizeAfterConstraint(window, size_expected);
    *out_pos = pos_min;
    if (corner_norm.x == 0.0f)
        out_pos->x -= (size_constrained.x - size_expected.x);
    if (corner_norm.y == 0.0f)
        out_pos->y -= (size_constrained.y - size_expected.y);
    *out_size = size_constrained;
}